

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O1

void __thiscall CS248::Camera::moveBy(Camera *this,double dx,double dy,double d)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Vector3D *pVVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar5 = d / this->screenDist;
  pVVar4 = Matrix3x3::operator[](&this->c2w,0);
  dVar2 = pVVar4->x;
  dVar3 = pVVar4->y;
  dVar1 = pVVar4->z;
  pVVar4 = Matrix3x3::operator[](&this->c2w,1);
  dVar8 = dx * dVar5;
  dVar5 = dy * dVar5;
  dVar6 = dVar5 * pVVar4->x + dVar8 * dVar2;
  dVar7 = dVar5 * pVVar4->y + dVar8 * dVar3;
  dVar1 = pVVar4->z * dVar5 + dVar1 * dVar8;
  dVar2 = (this->targetPos).x;
  dVar3 = (this->targetPos).y;
  dVar5 = (this->targetPos).z;
  (this->pos).x = (this->pos).x + dVar6;
  (this->pos).y = (this->pos).y + dVar7;
  (this->pos).z = dVar1 + (this->pos).z;
  (this->targetPos).x = dVar6 + dVar2;
  (this->targetPos).y = dVar7 + dVar3;
  (this->targetPos).z = dVar1 + dVar5;
  return;
}

Assistant:

void Camera::moveBy(const double dx, const double dy, const double d) {
    const double scaleFactor = d / screenDist;
    const Vector3D& displacement = c2w[0] * (dx * scaleFactor) + c2w[1] * (dy * scaleFactor);
    pos += displacement;
    targetPos += displacement;
}